

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_string<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  size_t *psVar1;
  element_type *peVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  location first;
  source_location src;
  string local_260;
  string local_240;
  location local_220;
  undefined1 local_1d8 [48];
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  _Alloc_hider local_198;
  size_t local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  pointer local_178;
  pointer pbStack_170;
  pointer local_168;
  undefined1 local_160 [32];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  _Alloc_hider local_b8;
  size_t local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pointer local_98;
  pointer pbStack_90;
  pointer local_88;
  failure<toml::error_info> local_80;
  
  location::location(&local_220,loc);
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar3 = loc->location_;
  lVar4 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar5 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar4;
  if (uVar3 < uVar5) {
    psVar1 = &loc->location_;
    if (*(char *)(lVar4 + uVar3) == '\"') {
      local_160._0_8_ = &PTR__scanner_base_00539938;
      local_160._8_8_ = "\"\"\"";
      local_160._16_8_ = (pointer)0x3;
      literal::scan((region *)local_1d8,(literal *)local_160,loc);
      region::~region((region *)local_1d8);
      (loc->source_).
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_220.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &local_220.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if ((element_type *)local_1d8._0_8_ == (element_type *)0x0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&loc->source_name_,&local_220.source_name_);
        loc->column_number_ = local_220.column_number_;
        *psVar1 = local_220.location_;
        loc->line_number_ = local_220.line_number_;
        parse_basic_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&loc->source_name_,&local_220.source_name_);
        loc->column_number_ = local_220.column_number_;
        *psVar1 = local_220.location_;
        loc->line_number_ = local_220.line_number_;
        parse_ml_basic_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      goto LAB_003b702d;
    }
    if ((uVar3 < uVar5) && (*(char *)(lVar4 + uVar3) == '\'')) {
      local_160._0_8_ = &PTR__scanner_base_00539938;
      local_160._8_8_ = "\'\'\'";
      local_160._16_8_ = (pointer)0x3;
      literal::scan((region *)local_1d8,(literal *)local_160,loc);
      region::~region((region *)local_1d8);
      (loc->source_).
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_220.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &local_220.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if ((element_type *)local_1d8._0_8_ == (element_type *)0x0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&loc->source_name_,&local_220.source_name_);
        loc->column_number_ = local_220.column_number_;
        *psVar1 = local_220.location_;
        loc->line_number_ = local_220.line_number_;
        parse_literal_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&loc->source_name_,&local_220.source_name_);
        loc->column_number_ = local_220.column_number_;
        *psVar1 = local_220.location_;
        loc->line_number_ = local_220.line_number_;
        parse_ml_literal_string<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      goto LAB_003b702d;
    }
  }
  region::region((region *)local_160,loc);
  source_location::source_location((source_location *)local_1d8,(region *)local_160);
  region::~region((region *)local_160);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,"toml::parse_string: not a string","");
  local_b8._M_p = (pointer)&local_a8;
  local_c8 = local_1a8;
  uStack_c4 = uStack_1a4;
  uStack_c0 = uStack_1a0;
  uStack_bc = uStack_19c;
  local_d8 = local_1d8._32_4_;
  uStack_d4 = local_1d8._36_4_;
  uStack_d0 = local_1d8._40_4_;
  uStack_cc = local_1d8._44_4_;
  local_e8 = local_1d8._16_4_;
  uStack_e4 = local_1d8._20_4_;
  uStack_e0 = local_1d8._24_4_;
  uStack_dc = local_1d8._28_4_;
  local_f8 = (element_type *)local_1d8._0_8_;
  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p == &local_188) {
    local_a8._8_8_ = local_188._8_8_;
  }
  else {
    local_b8._M_p = local_198._M_p;
  }
  local_b0 = local_190;
  local_190 = 0;
  local_188._M_local_buf[0] = '\0';
  local_98 = local_178;
  pbStack_90 = pbStack_170;
  local_88 = local_168;
  local_178 = (pointer)0x0;
  pbStack_170 = (pointer)0x0;
  local_168 = (pointer)0x0;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_198._M_p = (pointer)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"here","");
  make_error_info<>((error_info *)local_160,&local_240,(source_location *)&local_f8,&local_260);
  err<toml::error_info>(&local_80,(error_info *)local_160);
  __return_storage_ptr__->is_ok_ = false;
  failure<toml::error_info>::failure
            ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_80);
  failure<toml::error_info>::~failure(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != local_118) {
    operator_delete(local_128._M_p,local_118[0]._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_140);
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location((source_location *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location((source_location *)local_1d8);
LAB_003b702d:
  location::~location(&local_220);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    if( ! loc.eof() && loc.current() == '"')
    {
        if(literal("\"\"\"").scan(loc).is_ok())
        {
            loc = first;
            return parse_ml_basic_string(loc, ctx);
        }
        else
        {
            loc = first;
            return parse_basic_string(loc, ctx);
        }
    }
    else if( ! loc.eof() && loc.current() == '\'')
    {
        if(literal("'''").scan(loc).is_ok())
        {
            loc = first;
            return parse_ml_literal_string(loc, ctx);
        }
        else
        {
            loc = first;
            return parse_literal_string(loc, ctx);
        }
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_string: "
            "not a string", std::move(src), "here"));
    }
}